

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionTest.cpp
# Opt level: O1

void __thiscall ActionTest::insertTest(ActionTest *this)

{
  pointer psVar1;
  pointer pRVar2;
  Edge e;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>
  _Var3;
  _List_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  Insert action;
  Insert local_48;
  
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48.super_Action._vptr_Action = (_func_int **)0x1;
  local_48.super_Action.rel =
       (set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
        *)0x0;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current ==
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    p_Var4 = (_List_node_base *)0x0;
  }
  else {
    p_Var4 = ((_Var3._M_current)->m_iter)._M_node + 2;
  }
  e.m_eproperty = p_Var4;
  e.super_edge_base<boost::undirected_tag,_unsigned_long> =
       (edge_base<boost::undirected_tag,_unsigned_long>)(ZEXT816(1) << 0x40);
  Insert::Insert(&local_48,&pRVar2->a_pred,e);
  Insert::undo(&local_48);
  pRVar2 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&(pRVar2->a_pred)._M_t._M_impl + 0x28) != 2) {
    __assert_fail("rel[0].a_pred.size()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x20,"void ActionTest::insertTest()");
  }
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current ==
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = (_Base_ptr)(((_Var3._M_current)->m_iter)._M_node + 2);
  }
  p_Var8 = (_Base_ptr)((long)&(pRVar2->a_pred)._M_t._M_impl + 8);
  p_Var7 = p_Var8;
  for (p_Var6 = *(_Base_ptr *)((long)&(pRVar2->a_pred)._M_t._M_impl + 0x10);
      p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar9]) {
    bVar9 = p_Var6[1]._M_left < p_Var5;
    if (!bVar9) {
      p_Var7 = p_Var6;
    }
  }
  if ((p_Var7 != p_Var8) && (p_Var7[1]._M_left <= p_Var5)) {
    p_Var8 = p_Var7;
  }
  pRVar2 = (this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var5 = (_Base_ptr)((long)&(pRVar2->a_pred)._M_t._M_impl + 8);
  if (p_Var8 != p_Var5) {
    psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                      (*(undefined8 *)
                        &(psVar1->super_StoredVertex).m_out_edges.
                         super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       ,*(pointer *)
                         ((long)&(psVar1->super_StoredVertex).m_out_edges.
                                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                         + 8));
    if (_Var3._M_current ==
        *(pointer *)
         ((long)&(psVar1->super_StoredVertex).m_out_edges.
                 super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
         + 8)) {
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = (_Base_ptr)(((_Var3._M_current)->m_iter)._M_node + 2);
    }
    p_Var8 = p_Var5;
    for (p_Var7 = *(_Base_ptr *)((long)&(pRVar2->a_pred)._M_t._M_impl + 0x10);
        p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar9]) {
      bVar9 = p_Var7[1]._M_left < p_Var6;
      if (!bVar9) {
        p_Var8 = p_Var7;
      }
    }
    if ((p_Var8 != p_Var5) && (p_Var8[1]._M_left <= p_Var6)) {
      p_Var5 = p_Var8;
    }
    if (p_Var5 != (_Base_ptr)
                  ((long)&(((this->rel).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                            _M_impl.super__Vector_impl_data._M_start)->a_pred)._M_t._M_impl + 8U)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[+] insert action test OK!",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      return;
    }
    __assert_fail("rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                  ,0x22,"void ActionTest::insertTest()");
  }
  __assert_fail("rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/ActionTest.cpp"
                ,0x21,"void ActionTest::insertTest()");
}

Assistant:

void ActionTest::insertTest()
{
    Insert action(rel[0].a_pred, edge(0, 1, G).first);
    action.undo();

    assert(rel[0].a_pred.size()==2);
    assert(rel[0].a_pred.find(edge(0, 2, G).first) != rel[0].a_pred.end());
    assert(rel[0].a_pred.find(edge(0, 3, G).first) != rel[0].a_pred.end());

    std::cout << "[+] insert action test OK!" << std::endl;
}